

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v9::detail::specs_handler<char>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<char> *this)

{
  uint uVar1;
  buffer_context<char> *this_00;
  
  uVar1 = this->parse_context_->next_arg_id_;
  if (-1 < (int)uVar1) {
    this_00 = this->context_;
    this->parse_context_->next_arg_id_ = uVar1 + 1;
    get_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>,int>
              (__return_storage_ptr__,(detail *)this_00,
               (basic_format_context<fmt::v9::appender,_char> *)(ulong)uVar1,uVar1 + 1);
    return __return_storage_ptr__;
  }
  throw_format_error("cannot switch from manual to automatic argument indexing");
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }